

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<short>::WindowList<short,false>
          (WindowQuantileState<short> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *list,
          idx_t lidx,QuantileBindData *bind_data)

{
  data_ptr_t pdVar1;
  size_type *psVar2;
  data_ptr_t pdVar3;
  short sVar4;
  idx_t iVar5;
  Vector *result;
  const_reference q_00;
  long lVar6;
  long lVar7;
  unsigned_long *q;
  size_type *psVar8;
  
  pdVar1 = list->data;
  lVar7 = lidx * 0x10;
  iVar5 = ListVector::GetListSize(list);
  *(idx_t *)(pdVar1 + lVar7) = iVar5;
  lVar6 = ((long)(bind_data->quantiles).
                 super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bind_data->quantiles).
                 super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  *(long *)(pdVar1 + lVar7 + 8) = lVar6;
  ListVector::Reserve(list,lVar6 + iVar5);
  ListVector::SetListSize(list,*(long *)(pdVar1 + lVar7 + 8) + *(long *)(pdVar1 + lVar7));
  result = ListVector::GetEntry(list);
  psVar8 = (bind_data->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (bind_data->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    pdVar3 = result->data;
    do {
      q_00 = vector<duckdb::QuantileValue,_true>::operator[](&bind_data->quantiles,*psVar8);
      sVar4 = WindowScalar<short,false>(this,data,frames,n,result,q_00);
      *(short *)(pdVar3 + *psVar8 * 2 + *(long *)(pdVar1 + lVar7) * 2) = sVar4;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  return;
}

Assistant:

void WindowList(CursorType &data, const SubFrames &frames, const idx_t n, Vector &list, const idx_t lidx,
	                const QuantileBindData &bind_data) const {
		D_ASSERT(n > 0);
		// Result is a constant LIST<CHILD_TYPE> with a fixed length
		auto ldata = FlatVector::GetData<list_entry_t>(list);
		auto &lentry = ldata[lidx];
		lentry.offset = ListVector::GetListSize(list);
		lentry.length = bind_data.quantiles.size();

		ListVector::Reserve(list, lentry.offset + lentry.length);
		ListVector::SetListSize(list, lentry.offset + lentry.length);
		auto &result = ListVector::GetEntry(list);
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			rdata[lentry.offset + q] = WindowScalar<CHILD_TYPE, DISCRETE>(data, frames, n, result, quantile);
		}
	}